

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::getTextureReturnType
          (HlslParseContext *this,TSampler *sampler,TType *retType)

{
  TSampler TVar1;
  pointer ppTVar2;
  TTypeList *userDef;
  ulong uVar3;
  TType resultType;
  pool_allocator<char> local_e8;
  TString local_e0;
  TType local_b8;
  
  TVar1 = *sampler;
  if ((~(uint)TVar1 & 0x1e000000) == 0) {
    TType::TType(&local_b8,(uint)TVar1 & 0xff,EvqTemporary,(uint)TVar1 >> 0x16 & 7,0,0,false);
  }
  else {
    ppTVar2 = (this->textureReturnStruct).
              super_vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
              .
              super__Vector_base<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (ulong)((uint)TVar1 >> 0x19 & 0xf);
    if ((ulong)((long)(this->textureReturnStruct).
                      super_vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                      .
                      super__Vector_base<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2 >> 3) < uVar3) {
      __assert_fail("textureReturnStruct.size() >= sampler.structReturnIndex",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0x2642,
                    "void glslang::HlslParseContext::getTextureReturnType(const TSampler &, TType &) const"
                   );
    }
    userDef = ppTVar2[uVar3];
    local_e8.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_e0,
               "",&local_e8);
    TType::TType(&local_b8,userDef,&local_e0);
  }
  TType::shallowCopy(retType,&local_b8);
  return;
}

Assistant:

void HlslParseContext::getTextureReturnType(const TSampler& sampler, TType& retType) const
{
    if (sampler.hasReturnStruct()) {
        assert(textureReturnStruct.size() >= sampler.structReturnIndex);

        // We land here if the texture return is a structure.
        TTypeList* blockStruct = textureReturnStruct[sampler.structReturnIndex];

        const TType resultType(blockStruct, "");
        retType.shallowCopy(resultType);
    } else {
        // We land here if the texture return is a vector or scalar.
        const TType resultType(sampler.type, EvqTemporary, sampler.getVectorSize());
        retType.shallowCopy(resultType);
    }
}